

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_task.c
# Opt level: O1

void s_task_next(s_awaiter_t *__awaiter_dummy__)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint64_t uVar6;
  s_list_t *psVar7;
  __useconds_t __useconds;
  long *in_FS_OFFSET;
  undefined1 auVar8 [16];
  
  lVar1 = *in_FS_OFFSET;
  *(undefined1 *)(in_FS_OFFSET[-8] + 0x50) = 0;
  s_timer_run();
  psVar7 = (s_list_t *)(lVar1 + -0x50);
  iVar3 = s_list_is_empty(psVar7);
  if (iVar3 != 0) {
    do {
      _Var2 = rbt_is_empty((RBTree *)(lVar1 + -0x38));
      if (_Var2) {
        uVar4 = s_event_cancel_dead_waiting_tasks_();
        uVar5 = s_mutex_cancel_dead_waiting_tasks_();
        if (uVar5 + uVar4 == 0) {
          s_task_next_cold_1();
          __useconds = 0xfffffc18;
          goto LAB_00101724;
        }
      }
      else {
        uVar6 = s_timer_wait_recent();
        __useconds = (int)uVar6 * 1000;
LAB_00101724:
        usleep(__useconds);
      }
      s_timer_run();
      iVar3 = s_list_is_empty(psVar7);
    } while (iVar3 != 0);
  }
  iVar3 = s_list_is_empty(psVar7);
  if (iVar3 == 0) {
    lVar1 = in_FS_OFFSET[-8];
    psVar7 = s_list_get_next(psVar7);
    in_FS_OFFSET[-8] = (long)psVar7;
    s_list_detach(psVar7);
    if (lVar1 != in_FS_OFFSET[-8]) {
      auVar8 = jump_fcontext(*(undefined8 *)(in_FS_OFFSET[-8] + 0x40));
      *(long *)*auVar8._8_8_ = auVar8._0_8_;
    }
  }
  else {
    s_task_next_cold_2();
  }
  return;
}

Assistant:

void s_task_next(__async__) {
    g_globals.current_task->waiting_cancelled = false;
    s_timer_run();
    s_task_call_next(__await__);
}